

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsVulkanSampledImage(Instruction *this)

{
  uint32_t uVar1;
  Op OVar2;
  DefUseManager *pDVar3;
  Instruction *this_00;
  
  if (this->opcode_ == OpTypePointer) {
    uVar1 = GetSingleWordInOperand(this,0);
    if (uVar1 != 0) {
      return false;
    }
    pDVar3 = IRContext::get_def_use_mgr(this->context_);
    uVar1 = GetSingleWordInOperand(this,1);
    this_00 = analysis::DefUseManager::GetDef(pDVar3,uVar1);
    OVar2 = this_00->opcode_;
    if ((OVar2 & ~OpUndef) == OpTypeArray) {
      pDVar3 = IRContext::get_def_use_mgr(this->context_);
      uVar1 = GetSingleWordInOperand(this_00,0);
      this_00 = analysis::DefUseManager::GetDef(pDVar3,uVar1);
      OVar2 = this_00->opcode_;
    }
    if ((OVar2 == OpTypeImage) && (uVar1 = GetSingleWordInOperand(this_00,1), uVar1 != 5)) {
      uVar1 = GetSingleWordInOperand(this_00,5);
      return uVar1 == 1;
    }
  }
  return false;
}

Assistant:

bool Instruction::IsVulkanSampledImage() const {
  if (opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  spv::StorageClass storage_class =
      spv::StorageClass(GetSingleWordInOperand(kPointerTypeStorageClassIndex));
  if (storage_class != spv::StorageClass::UniformConstant) {
    return false;
  }

  Instruction* base_type =
      context()->get_def_use_mgr()->GetDef(GetSingleWordInOperand(1));

  // Unpack the optional layer of arraying.
  if (base_type->opcode() == spv::Op::OpTypeArray ||
      base_type->opcode() == spv::Op::OpTypeRuntimeArray) {
    base_type = context()->get_def_use_mgr()->GetDef(
        base_type->GetSingleWordInOperand(0));
  }

  if (base_type->opcode() != spv::Op::OpTypeImage) {
    return false;
  }

  if (spv::Dim(base_type->GetSingleWordInOperand(kTypeImageDimIndex)) ==
      spv::Dim::Buffer) {
    return false;
  }

  // Check if the image is sampled.  If we know for sure that it is,
  // then return true.
  return base_type->GetSingleWordInOperand(kTypeImageSampledIndex) == 1;
}